

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2StartElement(void *ctx,xmlChar *fullname,xmlChar **atts)

{
  xmlChar **ppxVar1;
  long lVar2;
  _xmlNode *p_Var3;
  xmlDtdPtr dtd;
  uint uVar4;
  int iVar5;
  uint uVar6;
  xmlChar *pxVar7;
  xmlNodePtr pxVar8;
  xmlElementPtr pxVar9;
  xmlAttributePtr pxVar10;
  xmlChar *pxVar11;
  xmlNsPtr ns;
  xmlParserCtxtPtr ctxt;
  xmlChar **ppxVar12;
  xmlNodePtr pxVar13;
  xmlAttributePtr *ppxVar14;
  xmlAttributePtr pxVar15;
  xmlChar *prefix;
  uint local_8c;
  xmlChar *local_88;
  xmlNodePtr local_80;
  xmlNodePtr local_78;
  xmlChar *local_70;
  xmlChar local_68 [56];
  
  if (fullname != (xmlChar *)0x0 && ctx != (void *)0x0) {
    lVar2 = *(long *)((long)ctx + 0x10);
    if (lVar2 != 0) {
      pxVar13 = *(xmlNodePtr *)((long)ctx + 0x50);
      if (((*(int *)((long)ctx + 0x9c) != 0) && (*(long *)(lVar2 + 0x58) == 0)) &&
         ((lVar2 = *(long *)(lVar2 + 0x50), lVar2 == 0 ||
          ((((*(long *)(lVar2 + 0x48) == 0 && (*(long *)(lVar2 + 0x50) == 0)) &&
            (*(long *)(lVar2 + 0x58) == 0)) && (*(long *)(lVar2 + 0x60) == 0)))))) {
        xmlErrValid((xmlParserCtxtPtr)ctx,XML_ERR_NO_DTD,"Validation failed: no DTD found !",
                    (char *)0x0,(char *)0x0);
        *(undefined4 *)((long)ctx + 0x9c) = 0;
      }
      pxVar7 = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,&prefix);
      pxVar8 = xmlNewDocNodeEatName
                         (*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,pxVar7,(xmlChar *)0x0);
      if (pxVar8 == (xmlNodePtr)0x0) {
        if (prefix != (xmlChar *)0x0) {
          (*xmlFree)(prefix);
        }
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
      }
      else {
        p_Var3 = (*(xmlNodePtr *)((long)ctx + 0x10))->children;
        if (p_Var3 == (_xmlNode *)0x0) {
          xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x10),pxVar8);
        }
        else if (pxVar13 == (xmlNodePtr)0x0) {
          pxVar13 = p_Var3;
        }
        *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
        if ((*(int *)((long)ctx + 0x1b4) != 0) && (*(long *)((long)ctx + 0x38) != 0)) {
          uVar6 = *(uint *)(*(long *)((long)ctx + 0x38) + 0x34);
          uVar4 = 0xffff;
          if (uVar6 < 0xffff) {
            uVar4 = uVar6;
          }
          pxVar8->line = (unsigned_short)uVar4;
        }
        iVar5 = nodePush((xmlParserCtxtPtr)ctx,pxVar8);
        if (iVar5 < 0) {
          xmlUnlinkNode(pxVar8);
          xmlFreeNode(pxVar8);
        }
        else {
          if (pxVar13 != (xmlNodePtr)0x0) {
            if (pxVar13->type == XML_ELEMENT_NODE) {
              xmlAddChild(pxVar13,pxVar8);
            }
            else {
              xmlAddSibling(pxVar13,pxVar8);
            }
          }
          if (*(int *)((long)ctx + 0x34) == 0) {
            dtd = *(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50);
            local_80 = pxVar13;
            local_78 = pxVar8;
            if ((dtd != (xmlDtdPtr)0x0) || (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) {
              local_88 = prefix;
              pxVar9 = xmlGetDtdQElementDesc(dtd,pxVar7,prefix);
              local_8c = (uint)CONCAT71((int7)((ulong)pxVar9 >> 8),pxVar9 != (xmlElementPtr)0x0);
              local_70 = pxVar7;
              if (pxVar9 == (xmlElementPtr)0x0) {
                pxVar9 = xmlGetDtdQElementDesc
                                   (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar7,
                                    local_88);
              }
              while (pxVar9 != (xmlElementPtr)0x0) {
                if (((*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) == 1) &&
                    (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) != 0)) &&
                   (*(int *)((long)ctx + 0x9c) != 0)) {
                  for (pxVar15 = pxVar9->attributes; pxVar15 != (xmlAttributePtr)0x0;
                      pxVar15 = pxVar15->nexth) {
                    if (((pxVar15->defaultValue != (xmlChar *)0x0) &&
                        (pxVar10 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                       (*(long *)((long)ctx + 0x10) + 0x58),
                                                      pxVar15->elem,pxVar15->name,pxVar15->prefix),
                        pxVar10 == pxVar15)) &&
                       (pxVar10 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)
                                                      (*(long *)((long)ctx + 0x10) + 0x50),
                                                     pxVar15->elem,pxVar15->name,pxVar15->prefix),
                       pxVar10 == (xmlAttributePtr)0x0)) {
                      if (pxVar15->prefix == (xmlChar *)0x0) {
                        pxVar7 = xmlStrdup(pxVar15->name);
                      }
                      else {
                        pxVar7 = xmlStrdup(pxVar15->prefix);
                        pxVar7 = xmlStrcat(pxVar7,":");
                        pxVar7 = xmlStrcat(pxVar7,pxVar15->name);
                      }
                      if (pxVar7 == (xmlChar *)0x0) {
                        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
                        break;
                      }
                      ppxVar12 = atts;
                      if (atts == (xmlChar **)0x0) {
LAB_00177bb5:
                        xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_STANDALONE_DEFAULTED,
                                    "standalone: attribute %s on %s defaulted from external subset\n"
                                    ,(char *)pxVar7,(char *)pxVar15->elem);
                      }
                      else {
                        do {
                          if (*ppxVar12 == (xmlChar *)0x0) goto LAB_00177bb5;
                          iVar5 = xmlStrEqual(*ppxVar12,pxVar7);
                          ppxVar12 = ppxVar12 + 2;
                        } while (iVar5 == 0);
                      }
                      (*xmlFree)(pxVar7);
                    }
                  }
                }
                pxVar7 = local_70;
                ppxVar14 = &pxVar9->attributes;
                while (pxVar15 = *ppxVar14, pxVar15 != (xmlAttributePtr)0x0) {
                  if (pxVar15->defaultValue != (xmlChar *)0x0) {
                    if (pxVar15->prefix == (xmlChar *)0x0) {
LAB_00177c38:
                      iVar5 = xmlStrEqual(pxVar15->name,"xmlns");
                      if (iVar5 == 0) {
LAB_00177c48:
                        if ((*(byte *)((long)ctx + 0x1b0) & 4) == 0) goto LAB_00177cf8;
                      }
                    }
                    else {
                      iVar5 = xmlStrEqual(pxVar15->prefix,"xmlns");
                      if (iVar5 == 0) {
                        if (pxVar15->prefix == (xmlChar *)0x0) goto LAB_00177c38;
                        goto LAB_00177c48;
                      }
                    }
                    pxVar10 = xmlGetDtdQAttrDesc(*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x50),
                                                 pxVar15->elem,pxVar15->name,pxVar15->prefix);
                    if (pxVar10 == pxVar15 || pxVar10 == (xmlAttributePtr)0x0) {
                      pxVar11 = xmlBuildQName(pxVar15->name,pxVar15->prefix,local_68,0x32);
                      if (pxVar11 == (xmlChar *)0x0) {
                        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
                        goto LAB_00177d3c;
                      }
                      ppxVar12 = atts;
                      if (atts == (xmlChar **)0x0) {
LAB_00177cc1:
                        xmlSAX2AttributeInternal(ctx,pxVar11,pxVar15->defaultValue,local_88);
                      }
                      else {
                        do {
                          if (*ppxVar12 == (xmlChar *)0x0) goto LAB_00177cc1;
                          iVar5 = xmlStrEqual(*ppxVar12,pxVar11);
                          ppxVar12 = ppxVar12 + 2;
                        } while (iVar5 == 0);
                      }
                      if ((pxVar11 != local_68) && (pxVar11 != pxVar15->name)) {
                        (*xmlFree)(pxVar11);
                      }
                    }
                  }
LAB_00177cf8:
                  ppxVar14 = &pxVar15->nexth;
                }
                if ((local_8c & 1) == 0) break;
                pxVar9 = xmlGetDtdQElementDesc
                                   (*(xmlDtdPtr *)(*(long *)((long)ctx + 0x10) + 0x58),pxVar7,
                                    local_88);
                local_8c = 0;
              }
            }
LAB_00177d3c:
            pxVar8 = local_78;
            pxVar13 = local_80;
            if (atts != (xmlChar **)0x0) {
              for (ppxVar12 = atts + 1;
                  (pxVar7 = ppxVar12[-1], pxVar7 != (xmlChar *)0x0 && (*ppxVar12 != (xmlChar *)0x0))
                  ; ppxVar12 = ppxVar12 + 2) {
                if ((*pxVar7 == 'x') &&
                   ((((pxVar7[1] == 'm' && (pxVar7[2] == 'l')) && (pxVar7[3] == 'n')) &&
                    (pxVar7[4] == 's')))) {
                  xmlSAX2AttributeInternal(ctx,pxVar7,*ppxVar12,prefix);
                }
              }
            }
            ns = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),pxVar8,prefix);
            if ((pxVar13 != (xmlNodePtr)0x0) && (ns == (xmlNsPtr)0x0)) {
              ns = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),pxVar13,prefix);
            }
            if ((prefix != (xmlChar *)0x0) && (ns == (xmlNsPtr)0x0)) {
              ns = xmlNewNs(pxVar8,(xmlChar *)0x0,prefix);
              xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                           "Namespace prefix %s is not defined\n",prefix,(xmlChar *)0x0);
            }
            if (((ns != (xmlNsPtr)0x0) && (ns->href != (xmlChar *)0x0)) &&
               ((*ns->href != '\0' || (ns->prefix != (xmlChar *)0x0)))) {
              xmlSetNs(pxVar8,ns);
            }
          }
          if (atts != (xmlChar **)0x0) {
            pxVar7 = *atts;
            pxVar11 = atts[1];
            if (*(int *)((long)ctx + 0x34) == 0) {
              ppxVar12 = atts + 3;
              while ((pxVar7 != (xmlChar *)0x0 && (pxVar11 != (xmlChar *)0x0))) {
                if (((*pxVar7 != 'x') ||
                    (((pxVar7[1] != 'm' || (pxVar7[2] != 'l')) || (pxVar7[3] != 'n')))) ||
                   (pxVar7[4] != 's')) {
                  xmlSAX2AttributeInternal(ctx,pxVar7,pxVar11,(xmlChar *)0x0);
                }
                pxVar7 = ppxVar12[-1];
                pxVar11 = *ppxVar12;
                ppxVar12 = ppxVar12 + 2;
              }
            }
            else {
              ppxVar12 = atts + 3;
              while (pxVar7 != (xmlChar *)0x0) {
                xmlSAX2AttributeInternal(ctx,pxVar7,pxVar11,(xmlChar *)0x0);
                ppxVar1 = ppxVar12 + -1;
                pxVar11 = *ppxVar12;
                ppxVar12 = ppxVar12 + 2;
                pxVar7 = *ppxVar1;
              }
            }
          }
          if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(byte *)((long)ctx + 0xd0) & 1) == 0)) {
            iVar5 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                        *(xmlDocPtr *)((long)ctx + 0x10));
            if ((iVar5 < 1) && (*(undefined4 *)((long)ctx + 0x98) = 0, iVar5 < 0)) {
              *(undefined4 *)((long)ctx + 0x18) = 0;
            }
            uVar6 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                    *(xmlDocPtr *)((long)ctx + 0x10));
            *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar6;
            *(byte *)((long)ctx + 0xd0) = *(byte *)((long)ctx + 0xd0) | 1;
          }
        }
        if (prefix != (xmlChar *)0x0) {
          (*xmlFree)(prefix);
        }
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElement(void *ctx, const xmlChar *fullname, const xmlChar **atts)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;
    xmlNsPtr ns;
    xmlChar *name;
    xmlChar *prefix;
    const xmlChar *att;
    const xmlChar *value;
    int i;

    if ((ctx == NULL) || (fullname == NULL) || (ctxt->myDoc == NULL)) return;
    parent = ctxt->node;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2StartElement(%s)\n", fullname);
#endif

    /*
     * First check on validity:
     */
    if (ctxt->validate && (ctxt->myDoc->extSubset == NULL) &&
        ((ctxt->myDoc->intSubset == NULL) ||
	 ((ctxt->myDoc->intSubset->notations == NULL) &&
	  (ctxt->myDoc->intSubset->elements == NULL) &&
	  (ctxt->myDoc->intSubset->attributes == NULL) &&
	  (ctxt->myDoc->intSubset->entities == NULL)))) {
	xmlErrValid(ctxt, XML_ERR_NO_DTD,
	  "Validation failed: no DTD found !", NULL, NULL);
	ctxt->validate = 0;
    }


    /*
     * Split the full name into a namespace prefix and the tag name
     */
    name = xmlSplitQName(ctxt, fullname, &prefix);


    /*
     * Note : the namespace resolution is deferred until the end of the
     *        attributes parsing, since local namespace can be defined as
     *        an attribute at this level.
     */
    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL, name, NULL);
    if (ret == NULL) {
        if (prefix != NULL)
	    xmlFree(prefix);
	xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
        return;
    }
    if (ctxt->myDoc->children == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext, "Setting %s as root\n", name);
#endif
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
    } else if (parent == NULL) {
        parent = ctxt->myDoc->children;
    }
    ctxt->nodemem = -1;
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
		ret->line = ctxt->input->line;
	    else
	        ret->line = USHRT_MAX;
	}
    }

    /*
     * We are parsing a new node.
     */
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext, "pushing(%s)\n", name);
#endif
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        if (prefix != NULL)
            xmlFree(prefix);
        return;
    }

    /*
     * Link the child element
     */
    if (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE) {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding child %s to %s\n", name, parent->name);
#endif
	    xmlAddChild(parent, ret);
	} else {
#ifdef DEBUG_SAX_TREE
	    xmlGenericError(xmlGenericErrorContext,
		    "adding sibling %s to ", name);
	    xmlDebugDumpOneNode(stderr, parent, 0);
#endif
	    xmlAddSibling(parent, ret);
	}
    }

    if (!ctxt->html) {
        /*
         * Insert all the defaulted attributes from the DTD especially
         * namespaces
         */
        if ((ctxt->myDoc->intSubset != NULL) ||
            (ctxt->myDoc->extSubset != NULL)) {
            xmlCheckDefaultedAttributes(ctxt, name, prefix, atts);
        }

        /*
         * process all the attributes whose name start with "xmlns"
         */
        if (atts != NULL) {
            i = 0;
            att = atts[i++];
            value = atts[i++];
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] == 'x') && (att[1] == 'm') && (att[2] == 'l') &&
		    (att[3] == 'n') && (att[4] == 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, prefix);

		att = atts[i++];
		value = atts[i++];
	    }
        }

        /*
         * Search the namespace, note that since the attributes have been
         * processed, the local namespaces are available.
         */
        ns = xmlSearchNs(ctxt->myDoc, ret, prefix);
        if ((ns == NULL) && (parent != NULL))
            ns = xmlSearchNs(ctxt->myDoc, parent, prefix);
        if ((prefix != NULL) && (ns == NULL)) {
            ns = xmlNewNs(ret, NULL, prefix);
            xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace prefix %s is not defined\n",
                         prefix, NULL);
        }

        /*
         * set the namespace node, making sure that if the default namespace
         * is unbound on a parent we simply keep it NULL
         */
        if ((ns != NULL) && (ns->href != NULL) &&
            ((ns->href[0] != 0) || (ns->prefix != NULL)))
            xmlSetNs(ret, ns);
    }

    /*
     * process all the other attributes
     */
    if (atts != NULL) {
        i = 0;
	att = atts[i++];
	value = atts[i++];
	if (ctxt->html) {
	    while (att != NULL) {
		xmlSAX2AttributeInternal(ctxt, att, value, NULL);
		att = atts[i++];
		value = atts[i++];
	    }
	} else {
	    while ((att != NULL) && (value != NULL)) {
		if ((att[0] != 'x') || (att[1] != 'm') || (att[2] != 'l') ||
		    (att[3] != 'n') || (att[4] != 's'))
		    xmlSAX2AttributeInternal(ctxt, att, value, NULL);

		/*
		 * Next ones
		 */
		att = atts[i++];
		value = atts[i++];
	    }
	}
    }

#ifdef LIBXML_VALID_ENABLED
    /*
     * If it's the Document root, finish the DTD validation and
     * check the document root element for validity
     */
    if ((ctxt->validate) &&
        ((ctxt->vctxt.flags & XML_VCTXT_DTD_VALIDATED) == 0)) {
	int chk;

	chk = xmlValidateDtdFinal(&ctxt->vctxt, ctxt->myDoc);
	if (chk <= 0)
	    ctxt->valid = 0;
	if (chk < 0)
	    ctxt->wellFormed = 0;
	ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
	ctxt->vctxt.flags |= XML_VCTXT_DTD_VALIDATED;
    }
#endif /* LIBXML_VALID_ENABLED */

    if (prefix != NULL)
	xmlFree(prefix);

}